

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::bin_writer<3>::operator()
          (bin_writer<3> *this,
          back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> *it)

{
  int iVar1;
  bool bVar2;
  back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_> bVar3;
  byte *pbVar4;
  uint uVar5;
  char buffer [12];
  byte abStack_15 [13];
  
  bVar3 = (back_insert_iterator<std::__cxx11::list<char,_std::allocator<char>_>_>)it->container;
  iVar1 = *(int *)(this + 4);
  pbVar4 = abStack_15 + iVar1;
  uVar5 = *(uint *)this;
  do {
    *pbVar4 = (byte)uVar5 & 7 | 0x30;
    pbVar4 = pbVar4 + -1;
    bVar2 = 7 < uVar5;
    uVar5 = uVar5 >> 3;
  } while (bVar2);
  bVar3 = std::__copy_move<false,false,std::random_access_iterator_tag>::
          __copy_m<char*,std::back_insert_iterator<std::__cxx11::list<char,std::allocator<char>>>>
                    ((char *)(abStack_15 + 1),(char *)(abStack_15 + (long)iVar1 + 1),bVar3);
  it->container = (list<char,_std::allocator<char>_> *)bVar3;
  return;
}

Assistant:

void operator()(It &&it) const {
        it = internal::format_uint<BITS, char_type>(it, abs_value, num_digits);
      }